

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threading_pthreads.cpp
# Opt level: O0

void __thiscall crnlib::mutex::~mutex(mutex *this)

{
  int iVar1;
  mutex *this_local;
  
  iVar1 = pthread_mutex_destroy((pthread_mutex_t *)this);
  if (iVar1 != 0) {
    crnlib_assert("mutex::~mutex: pthread_mutex_destroy() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zellski[P]crunch/crnlib/crn_threading_pthreads.cpp"
                  ,0x4a);
  }
  return;
}

Assistant:

mutex::~mutex() {
#ifdef CRNLIB_BUILD_DEBUG
  if (m_lock_count)
    crnlib_assert("mutex::~mutex: mutex is still locked", __FILE__, __LINE__);
#endif
  if (pthread_mutex_destroy(&m_mutex))
    crnlib_assert("mutex::~mutex: pthread_mutex_destroy() failed", __FILE__, __LINE__);
}